

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Instance::Mark(Instance *this,Store *store)

{
  pointer pRVar1;
  pointer pEVar2;
  Ref *ref_7;
  pointer pRVar3;
  Ref *ref;
  pointer pEVar4;
  
  Store::Mark(store,(Ref)(this->module_).index);
  pRVar1 = (this->imports_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->imports_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    Store::Mark(store,(Ref)pRVar3->index);
  }
  pRVar1 = (this->funcs_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->funcs_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    Store::Mark(store,(Ref)pRVar3->index);
  }
  pRVar1 = (this->memories_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->memories_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    Store::Mark(store,(Ref)pRVar3->index);
  }
  pRVar1 = (this->tables_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->tables_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    Store::Mark(store,(Ref)pRVar3->index);
  }
  pRVar1 = (this->globals_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->globals_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    Store::Mark(store,(Ref)pRVar3->index);
  }
  pRVar1 = (this->tags_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->tags_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    Store::Mark(store,(Ref)pRVar3->index);
  }
  pRVar1 = (this->exports_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->exports_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    Store::Mark(store,(Ref)pRVar3->index);
  }
  pEVar2 = (this->elems_).
           super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar4 = (this->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar4 != pEVar2; pEVar4 = pEVar4 + 1) {
    pRVar1 = (pEVar4->elements_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pRVar3 = (pEVar4->elements_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
      Store::Mark(store,(Ref)pRVar3->index);
    }
  }
  return;
}

Assistant:

void Instance::Mark(Store& store) {
  store.Mark(module_);
  store.Mark(imports_);
  store.Mark(funcs_);
  store.Mark(memories_);
  store.Mark(tables_);
  store.Mark(globals_);
  store.Mark(tags_);
  store.Mark(exports_);
  for (auto&& elem : elems_) {
    elem.Mark(store);
  }
}